

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-types.c
# Opt level: O1

void fy_parse_eventp_list_recycle_all(fy_parser *fyp,fy_eventp_list *_l)

{
  fy_eventp *pfVar1;
  list_head *plVar2;
  list_head *plVar3;
  fy_eventp *fyep;
  
  while( true ) {
    if (_l == (fy_eventp_list *)0x0) {
      fyep = (fy_eventp *)0x0;
    }
    else {
      pfVar1 = (fy_eventp *)(_l->_lh).next;
      fyep = (fy_eventp *)0x0;
      if (pfVar1 != (fy_eventp *)_l) {
        fyep = pfVar1;
      }
    }
    if (fyep != (fy_eventp *)0x0 && _l != (fy_eventp_list *)0x0) {
      plVar2 = (fyep->node).next;
      plVar3 = (fyep->node).prev;
      plVar2->prev = plVar3;
      plVar3->next = plVar2;
      (fyep->node).next = (list_head *)0x0;
      (fyep->node).prev = (list_head *)0x0;
      (fyep->node).next = &fyep->node;
      (fyep->node).prev = &fyep->node;
    }
    if (fyep == (fy_eventp *)0x0) break;
    fy_parse_eventp_recycle(fyp,fyep);
  }
  return;
}

Assistant:

struct fy_eventp *fy_parse_eventp_alloc(struct fy_parser *fyp) {
    struct fy_eventp *fyep;

    fyep = fy_parse_eventp_alloc_simple(fyp);
    if (!fyep)
        return NULL;
    fyep->fyp = fyp;
    fyep->e.type = FYET_NONE;

    return fyep;
}